

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::addSubpassSampling
          (TBuiltIns *this,TSampler sampler,TString *typeName,int param_3,EProfile param_4)

{
  bool bVar1;
  char *__s;
  EProfile param_4_local;
  int param_3_local;
  TString *typeName_local;
  TBuiltIns *this_local;
  TSampler sampler_local;
  
  this_local._4_4_ = sampler;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            ((this->super_TBuiltInParseables).stageBuiltins + 4,this->prefixes[(uint)sampler & 0xff]
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            ((this->super_TBuiltInParseables).stageBuiltins + 4,"vec4 subpassLoad");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            ((this->super_TBuiltInParseables).stageBuiltins + 4,"(");
  __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        c_str(typeName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            ((this->super_TBuiltInParseables).stageBuiltins + 4,__s);
  bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4));
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((this->super_TBuiltInParseables).stageBuiltins + 4,", int");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            ((this->super_TBuiltInParseables).stageBuiltins + 4,");\n");
  return;
}

Assistant:

void TBuiltIns::addSubpassSampling(TSampler sampler, const TString& typeName, int /*version*/, EProfile /*profile*/)
{
    stageBuiltins[EShLangFragment].append(prefixes[sampler.type]);
    stageBuiltins[EShLangFragment].append("vec4 subpassLoad");
    stageBuiltins[EShLangFragment].append("(");
    stageBuiltins[EShLangFragment].append(typeName.c_str());
    if (sampler.isMultiSample())
        stageBuiltins[EShLangFragment].append(", int");
    stageBuiltins[EShLangFragment].append(");\n");
}